

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O0

char * google::protobuf::internal::TcParser::MpString<true>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  MicroString *str_00;
  TcParseTableBase *pTVar5;
  uint64_t table_00;
  ParseContext *pPVar6;
  FieldEntry *pFVar7;
  ParseContext *p;
  MessageLite *x;
  bool bVar8;
  unsigned_short uVar9;
  uint32_t uVar10;
  uint uVar11;
  char *pcVar12;
  string *this;
  Arena *pAVar13;
  Cord *pCVar14;
  Cord **ppCVar15;
  uint *puVar16;
  ulong uVar17;
  TailCallParseFunc UNRECOVERED_JUMPTABLE;
  uint16_t xform_val_00;
  string_view wire_bytes;
  string_view wire_bytes_00;
  undefined1 auVar18 [16];
  byte local_209;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_1c0 [2];
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_1b0;
  Cord *local_1a8;
  Cord *field_2;
  char *local_198;
  MicroString *local_190;
  MicroString *field_1;
  size_t local_180;
  string *local_178;
  string *str;
  Arena *arena;
  ArenaStringPtr *field;
  void *base;
  bool is_valid;
  bool need_init;
  bool is_oneof;
  uint16_t rep;
  MessageLite *pMStack_150;
  uint16_t xform_val;
  MessageLite *local_148;
  uint local_140;
  ushort local_13c;
  ushort local_13a;
  uint32_t decoded_wiretype;
  uint16_t card;
  uint16_t type_card;
  FieldEntry *entry;
  uint64_t hasbits_local;
  TcParseTableBase *table_local;
  ParseContext *ctx_local;
  char *ptr_local;
  MessageLite *msg_local;
  TcFieldData data_local;
  TcFieldData local_f8;
  TcFieldData local_f0;
  undefined1 local_e1;
  FieldEntry *pFStack_e0;
  bool always_return;
  TcParseTableBase *local_d8;
  ParseContext *local_d0;
  ParseContext *local_c8;
  MessageLite *local_c0;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_b8;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_b0;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_a8;
  TcFieldData data_1;
  FastFieldEntry *fast_entry;
  size_t idx;
  unsigned_short coded_tag;
  uint32_t has_bits_offset;
  
  entry = (FieldEntry *)hasbits;
  hasbits_local = (uint64_t)table;
  table_local = (TcParseTableBase *)ctx;
  ctx_local = (ParseContext *)ptr;
  ptr_local = (char *)msg;
  msg_local = (MessageLite *)data.field_0;
  uVar10 = TcFieldData::entry_offset((TcFieldData *)&msg_local);
  xform_val_00 = (uint16_t)hasbits;
  _decoded_wiretype =
       (TcParseTableBase *)
       RefAt<google::protobuf::internal::TcParseTableBase::FieldEntry>(table,(ulong)uVar10);
  local_13a = _decoded_wiretype->lookup_table_offset;
  local_13c = local_13a & 0x30;
  uVar10 = TcFieldData::tag((TcFieldData *)&msg_local);
  table_00 = hasbits_local;
  pTVar5 = _decoded_wiretype;
  local_140 = uVar10 & 7;
  if (local_140 != 2) {
    local_148 = msg_local;
    pcVar12 = (char *)(**(code **)(hasbits_local + 0x30))
                                (ptr_local,ctx_local,table_local,msg_local,hasbits_local,entry);
    return pcVar12;
  }
  if (local_13c == 0x20) {
    pMStack_150 = msg_local;
    pcVar12 = MpRepeatedString<true>
                        ((MessageLite *)ptr_local,(char *)ctx_local,(ParseContext *)table_local,
                         (TcFieldData)msg_local,(TcParseTableBase *)hasbits_local,(uint64_t)entry);
    return pcVar12;
  }
  base._6_2_ = local_13a & 0x600;
  base._4_2_ = local_13a & 0x1c0;
  base._3_1_ = local_13c == 0x30;
  base._2_1_ = 0;
  if (local_13c == 0x10) {
    anon_unknown_104::SetHas((FieldEntry *)_decoded_wiretype,(MessageLite *)ptr_local);
  }
  else if ((bool)base._3_1_) {
    uVar10 = TcFieldData::tag((TcFieldData *)&msg_local);
    base._2_1_ = ChangeOneof((TcParseTableBase *)table_00,(FieldEntry *)pTVar5,uVar10 >> 3,
                             (ParseContext *)table_local,(MessageLite *)ptr_local);
  }
  base._1_1_ = 0;
  field = (ArenaStringPtr *)
          MaybeGetSplitBase((MessageLite *)ptr_local,true,(TcParseTableBase *)hasbits_local);
  if (base._4_2_ == 0) {
    uVar11._0_2_ = _decoded_wiretype->has_bits_offset;
    uVar11._2_2_ = _decoded_wiretype->extension_offset;
    arena = (Arena *)RefAt<google::protobuf::internal::ArenaStringPtr>(field,(ulong)uVar11);
    if ((base._2_1_ & 1) != 0) {
      ArenaStringPtr::InitDefault((ArenaStringPtr *)arena);
    }
    str = (string *)MessageLite::GetArena((MessageLite *)ptr_local);
    if (str == (string *)0x0) {
      local_178 = ArenaStringPtr::MutableNoCopy_abi_cxx11_((ArenaStringPtr *)arena,(Arena *)0x0);
      ctx_local = (ParseContext *)
                  InlineGreedyStringParser(local_178,(char *)ctx_local,(ParseContext *)table_local);
    }
    else {
      ctx_local = (ParseContext *)
                  EpsCopyInputStream::ReadArenaString
                            ((EpsCopyInputStream *)table_local,(char *)ctx_local,
                             (ArenaStringPtr *)arena,(Arena *)str);
    }
    if (ctx_local == (ParseContext *)0x0) {
      anon_unknown_104::EnsureArenaStringIsNotDefault
                ((MessageLite *)ptr_local,(ArenaStringPtr *)arena);
    }
    else {
      this = ArenaStringPtr::Get_abi_cxx11_((ArenaStringPtr *)arena);
      auVar18 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)this);
      local_180 = auVar18._8_8_;
      field_1 = auVar18._0_8_;
      wire_bytes._M_str = (char *)hasbits_local;
      wire_bytes._M_len = local_180;
      base._1_1_ = MpVerifyUtf8((TcParser *)field_1,wire_bytes,_decoded_wiretype,
                                (FieldEntry *)(ulong)base._6_2_,xform_val_00);
    }
  }
  else if (base._4_2_ == 0x80) {
    if ((base._3_1_ & 1) == 0) {
      uVar4._0_2_ = _decoded_wiretype->has_bits_offset;
      uVar4._2_2_ = _decoded_wiretype->extension_offset;
      local_1a8 = RefAt<absl::lts_20250127::Cord>(field,(ulong)uVar4);
    }
    else if ((base._2_1_ & 1) == 0) {
      uVar3._0_2_ = _decoded_wiretype->has_bits_offset;
      uVar3._2_2_ = _decoded_wiretype->extension_offset;
      ppCVar15 = RefAt<absl::lts_20250127::Cord*>(ptr_local,(ulong)uVar3);
      local_1a8 = *ppCVar15;
    }
    else {
      pAVar13 = MessageLite::GetArena((MessageLite *)ptr_local);
      pCVar14 = Arena::Create<absl::lts_20250127::Cord>(pAVar13);
      uVar2._0_2_ = _decoded_wiretype->has_bits_offset;
      uVar2._2_2_ = _decoded_wiretype->extension_offset;
      local_1a8 = pCVar14;
      ppCVar15 = RefAt<absl::lts_20250127::Cord*>(ptr_local,(ulong)uVar2);
      *ppCVar15 = pCVar14;
    }
    ctx_local = (ParseContext *)
                InlineCordParser(local_1a8,(char *)ctx_local,(ParseContext *)table_local);
    if (ctx_local != (ParseContext *)0x0) {
      base._1_1_ = MpVerifyUtf8(local_1a8,(TcParseTableBase *)hasbits_local,
                                (FieldEntry *)_decoded_wiretype,base._6_2_);
    }
  }
  else {
    if (base._4_2_ != 0x140) {
      Unreachable("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                  ,0x967);
    }
    uVar1._0_2_ = _decoded_wiretype->has_bits_offset;
    uVar1._2_2_ = _decoded_wiretype->extension_offset;
    local_190 = RefAt<google::protobuf::internal::MicroString>(field,(ulong)uVar1);
    if ((base._2_1_ & 1) != 0) {
      MicroString::InitDefault(local_190);
    }
    pPVar6 = ctx_local;
    pTVar5 = table_local;
    str_00 = local_190;
    pAVar13 = MessageLite::GetArena((MessageLite *)ptr_local);
    ctx_local = (ParseContext *)
                EpsCopyInputStream::ReadMicroString
                          ((EpsCopyInputStream *)pTVar5,(char *)pPVar6,str_00,pAVar13);
    _field_2 = MicroString::Get(local_190);
    wire_bytes_00._M_str = (char *)hasbits_local;
    wire_bytes_00._M_len = (size_t)local_198;
    base._1_1_ = MpVerifyUtf8((TcParser *)field_2,wire_bytes_00,_decoded_wiretype,
                              (FieldEntry *)(ulong)base._6_2_,xform_val_00);
  }
  pcVar12 = ptr_local;
  pPVar6 = ctx_local;
  pTVar5 = table_local;
  local_209 = 1;
  if (ctx_local != (ParseContext *)0x0) {
    local_209 = base._1_1_ ^ 0xff;
  }
  if ((local_209 & 1) != 0) {
    TcFieldData::TcFieldData((TcFieldData *)&local_1b0);
    pcVar12 = Error((MessageLite *)pcVar12,(char *)pPVar6,(ParseContext *)pTVar5,
                    (TcFieldData)local_1b0,(TcParseTableBase *)hasbits_local,(uint64_t)entry);
    return pcVar12;
  }
  TcFieldData::TcFieldData((TcFieldData *)local_1c0);
  local_b8 = local_1c0[0];
  local_c0 = (MessageLite *)pcVar12;
  local_c8 = pPVar6;
  local_d0 = (ParseContext *)pTVar5;
  local_d8 = (TcParseTableBase *)hasbits_local;
  pFStack_e0 = entry;
  local_e1 = 0;
  bVar8 = EpsCopyInputStream::DataAvailable((EpsCopyInputStream *)pTVar5,(char *)pPVar6);
  x = local_c0;
  p = local_c8;
  pPVar6 = local_d0;
  if (!bVar8) {
    TcFieldData::TcFieldData(&local_f0);
    if (local_d8->has_bits_offset != 0) {
      uVar11 = (uint)pFStack_e0;
      puVar16 = RefAt<unsigned_int>(x,(ulong)(uint)local_d8->has_bits_offset);
      *puVar16 = uVar11 | *puVar16;
    }
    return (char *)p;
  }
  TcFieldData::TcFieldData(&local_f8);
  pTVar5 = local_d8;
  pFVar7 = pFStack_e0;
  uVar9 = UnalignedLoad<unsigned_short>((char *)p);
  uVar17 = (ulong)(int)((uint)uVar9 & (uint)pTVar5->fast_idx_mask);
  if ((uVar17 & 7) == 0) {
    data_1.field_0 =
         (anon_union_8_1_898a9ca8_for_TcFieldData_0)TcParseTableBase::fast_entry(pTVar5,uVar17 >> 3)
    ;
    local_a8.data =
         ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)((long)data_1.field_0 + 8))->data ^
         (ulong)uVar9;
    UNRECOVERED_JUMPTABLE =
         TcParseTableBase::FastFieldEntry::target((FastFieldEntry *)data_1.field_0);
    local_b0.data = local_a8.data;
    pcVar12 = (*UNRECOVERED_JUMPTABLE)
                        (x,(char *)p,pPVar6,(TcFieldData)local_a8,pTVar5,(uint64_t)pFVar7);
    return pcVar12;
  }
  protobuf_assumption_failed
            ("(idx & 7) == 0",
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
             ,0x452);
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::MpString(PROTOBUF_TC_PARAM_DECL) {
  const auto& entry = RefAt<FieldEntry>(table, data.entry_offset());
  const uint16_t type_card = entry.type_card;
  const uint16_t card = type_card & field_layout::kFcMask;
  const uint32_t decoded_wiretype = data.tag() & 7;

  if (decoded_wiretype != WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
    PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
  }
  if (card == field_layout::kFcRepeated) {
    PROTOBUF_MUSTTAIL return MpRepeatedString<is_split>(PROTOBUF_TC_PARAM_PASS);
  }
  const uint16_t xform_val = type_card & field_layout::kTvMask;
  const uint16_t rep = type_card & field_layout::kRepMask;

  // Mark the field as present:
  const bool is_oneof = card == field_layout::kFcOneof;
  bool need_init = false;
  if (card == field_layout::kFcOptional) {
    SetHas(entry, msg);
  } else if (is_oneof) {
    need_init = ChangeOneof(table, entry, data.tag() >> 3, ctx, msg);
  }

  bool is_valid = false;
  void* const base = MaybeGetSplitBase(msg, is_split, table);
  switch (rep) {
    case field_layout::kRepAString: {
      auto& field = RefAt<ArenaStringPtr>(base, entry.offset);
      if (need_init) field.InitDefault();
      Arena* arena = msg->GetArena();
      if (arena) {
        ptr = ctx->ReadArenaString(ptr, &field, arena);
      } else {
        std::string* str = field.MutableNoCopy(nullptr);
        ptr = InlineGreedyStringParser(str, ptr, ctx);
      }
      if (ABSL_PREDICT_FALSE(ptr == nullptr)) {
        EnsureArenaStringIsNotDefault(msg, &field);
        break;
      }
      is_valid = MpVerifyUtf8(field.Get(), table, entry, xform_val);
      break;
    }

    case field_layout::kRepMString: {
      auto& field = RefAt<MicroString>(base, entry.offset);
      if (need_init) field.InitDefault();
      ptr = ctx->ReadMicroString(ptr, field, msg->GetArena());
      is_valid = MpVerifyUtf8(field.Get(), table, entry, xform_val);
      break;
    }


    case field_layout::kRepCord: {
      absl::Cord* field;
      if (is_oneof) {
        if (need_init) {
          field = Arena::Create<absl::Cord>(msg->GetArena());
          RefAt<absl::Cord*>(msg, entry.offset) = field;
        } else {
          field = RefAt<absl::Cord*>(msg, entry.offset);
        }
      } else {
        field = &RefAt<absl::Cord>(base, entry.offset);
      }
      ptr = InlineCordParser(field, ptr, ctx);
      if (!ptr) break;
      is_valid = MpVerifyUtf8(*field, table, entry, xform_val);
      break;
    }

    default:
      Unreachable();
  }

  if (ABSL_PREDICT_FALSE(ptr == nullptr || !is_valid)) {
    PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
  }
  PROTOBUF_MUSTTAIL return ToTagDispatch(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}